

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)

{
  long lVar1;
  long *plVar2;
  QObjectData *pQVar3;
  long lVar4;
  QObject **this;
  bool bVar5;
  
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    bVar5 = false;
  }
  else {
    pQVar3 = (QCoreApplication::self->super_QObject).d_ptr.d;
    this = &pQVar3[2].parent;
    if (((ulong)this & 1) == 0) {
      QReadWriteLock::lockForRead((QReadWriteLock *)this);
      this = (QObject **)((ulong)this | 1);
    }
    if (pQVar3[2].q_ptr == (QObject *)0x0) {
LAB_00276b5d:
      bVar5 = false;
    }
    else {
      lVar4 = 0;
      do {
        if ((long)pQVar3[2].q_ptr << 3 == lVar4) goto LAB_00276b5d;
        lVar1 = lVar4 + 8;
        plVar2 = (long *)((long)pQVar3[2]._vptr_QObjectData + lVar4);
        lVar4 = lVar1;
      } while ((QTranslator *)*plVar2 != translator);
      bVar5 = lVar1 != 0;
    }
    if (((ulong)this & 1) != 0) {
      QReadWriteLock::unlock((QReadWriteLock *)((ulong)this & 0xfffffffffffffffe));
    }
  }
  return bVar5;
}

Assistant:

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)
{
    if (!QCoreApplication::self)
        return false;
    QCoreApplicationPrivate *d = QCoreApplication::self->d_func();
    QReadLocker locker(&d->translateMutex);
    return d->translators.contains(translator);
}